

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_ipairs_aux(jit_State *J,RecordFFData *rd)

{
  undefined2 uVar1;
  TRef TVar2;
  int iVar3;
  long *in_RSI;
  long in_RDI;
  jit_State *J_00;
  RecordIndex ix;
  jit_State *in_stack_ffffffffffffff08;
  long lVar4;
  undefined6 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff16;
  undefined4 uVar5;
  int32_t k;
  RecordIndex *ix_00;
  char *J_01;
  
  if ((**(uint **)(in_RDI + 0x88) & 0x1f000000) == 0xb000000) {
    if (0xfffeffff < *(uint *)(*in_RSI + 0xc)) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10),
                   (TraceError)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    J_00 = (jit_State *)(double)((int)*(double *)(*in_RSI + 8) + 1);
    ix_00 = *(RecordIndex **)(in_RDI + 0x68);
    uVar5 = *(undefined4 *)*in_RSI;
    k = -0xc;
    J_01 = "store to dead GC object";
    TVar2 = lj_opt_narrow_toint(in_stack_ffffffffffffff08,0);
    uVar1 = (undefined2)TVar2;
    lVar4 = in_RDI;
    TVar2 = lj_ir_kint(J_00,k);
    *(undefined2 *)(lVar4 + 0xa4) = 0x2913;
    *(undefined2 *)(lVar4 + 0xa0) = uVar1;
    *(short *)(lVar4 + 0xa2) = (short)TVar2;
    TVar2 = lj_opt_fold((jit_State *)CONCAT44(k,uVar5));
    **(TRef **)(in_RDI + 0x88) = TVar2;
    TVar2 = lj_record_idx((jit_State *)J_01,ix_00);
    *(TRef *)(*(long *)(in_RDI + 0x88) + 4) = TVar2;
    iVar3 = 2;
    if ((*(uint *)(*(long *)(in_RDI + 0x88) + 4) & 0x1f000000) == 0) {
      iVar3 = 0;
    }
    in_RSI[1] = (long)iVar3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_ipairs_aux(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  if (tref_istab(ix.tab)) {
    if (!tvisnumber(&rd->argv[1]))  /* No support for string coercion. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    setintV(&ix.keyv, numberVint(&rd->argv[1])+1);
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    ix.val = 0; ix.idxchain = 0;
    ix.key = lj_opt_narrow_toint(J, J->base[1]);
    J->base[0] = ix.key = emitir(IRTI(IR_ADD), ix.key, lj_ir_kint(J, 1));
    J->base[1] = lj_record_idx(J, &ix);
    rd->nres = tref_isnil(J->base[1]) ? 0 : 2;
  }  /* else: Interpreter will throw. */
}